

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::processNameChar(TestSpecParser *this,char c)

{
  bool bVar1;
  char c_local;
  TestSpecParser *this_local;
  
  if (c == '[') {
    bVar1 = std::operator==(&this->m_substring,"exclude:");
    if (bVar1) {
      this->m_exclusion = true;
    }
    else {
      endMode(this);
    }
    startNewMode(this,Tag);
  }
  return;
}

Assistant:

void TestSpecParser::processNameChar(char c) {
        if (c == '[') {
            if (m_substring == "exclude:")
                m_exclusion = true;
            else
                endMode();
            startNewMode(Tag);
        }
    }